

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlTextWriterPtr xmlNewTextWriterTree(xmlDocPtr doc,xmlNodePtr node,int compression)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserCtxtPtr ctxt;
  xmlSAXHandler saxHandler;
  xmlTextWriterPtr ret;
  int compression_local;
  xmlNodePtr node_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlNewTextWriterTree : invalid document tree!\n");
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(&ctxt,0,0x100);
    xmlSAX2InitDefaultSAXHandler((xmlSAXHandler *)&ctxt,1);
    saxHandler.setDocumentLocator = xmlTextWriterStartDocumentCallback;
    ctxt_00 = xmlCreatePushParserCtxt((xmlSAXHandlerPtr)&ctxt,(void *)0x0,(char *)0x0,0,(char *)0x0)
    ;
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                      "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      ctxt_00->dictNames = 0;
      saxHandler.serror = (xmlStructuredErrorFunc)xmlNewTextWriterPushParser(ctxt_00,compression);
      if ((xmlTextWriterPtr)saxHandler.serror == (xmlTextWriterPtr)0x0) {
        xmlFreeParserCtxt(ctxt_00);
        xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n");
        doc_local = (xmlDocPtr)0x0;
      }
      else {
        ctxt_00->myDoc = doc;
        ctxt_00->node = node;
        ((xmlTextWriterPtr)saxHandler.serror)->no_doc_free = 1;
        xmlSetDocCompressMode(doc,compression);
        doc_local = (xmlDocPtr)saxHandler.serror;
      }
    }
  }
  return (xmlTextWriterPtr)doc_local;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterTree(xmlDocPtr doc, xmlNodePtr node, int compression)
{
    xmlTextWriterPtr ret;
    xmlSAXHandler saxHandler;
    xmlParserCtxtPtr ctxt;

    if (doc == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterTree : invalid document tree!\n");
        return NULL;
    }

    memset(&saxHandler, '\0', sizeof(saxHandler));
    xmlSAX2InitDefaultSAXHandler(&saxHandler, 1);
    saxHandler.startDocument = xmlTextWriterStartDocumentCallback;

    ctxt = xmlCreatePushParserCtxt(&saxHandler, NULL, NULL, 0, NULL);
    if (ctxt == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n");
        return NULL;
    }
    /*
     * For some reason this seems to completely break if node names
     * are interned.
     */
    ctxt->dictNames = 0;

    ret = xmlNewTextWriterPushParser(ctxt, compression);
    if (ret == NULL) {
        xmlFreeParserCtxt(ctxt);
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n");
        return NULL;
    }

    ctxt->myDoc = doc;
    ctxt->node = node;
    ret->no_doc_free = 1;

    xmlSetDocCompressMode(doc, compression);

    return ret;
}